

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  undefined4 uVar15;
  _func_int **pp_Var16;
  ulong *puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  vint4 bi;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  vint8 bi_1;
  vfloat<4> fmin;
  vint<8> octant;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1340 [16];
  RTCIntersectFunctionNArguments local_1330;
  Geometry *local_1300;
  undefined8 local_12f8;
  RTCIntersectArguments *local_12f0;
  AccelData *local_12e8;
  ulong local_12e0;
  RayHitK<8> *local_12d8;
  RayQueryContext *local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  long local_12b8;
  long local_12b0;
  ulong local_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  undefined4 local_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  uint local_11e0;
  uint uStack_11dc;
  uint uStack_11d8;
  uint uStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  uint uStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  uint uStack_1124;
  undefined1 local_1120 [32];
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 uStack_10e8;
  undefined4 uStack_10e4;
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  uint uStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  uint uStack_fc4;
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  undefined1 auVar34 [64];
  undefined1 auVar58 [64];
  
  auVar38 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar28 = vpcmpeqd_avx2(auVar38,(undefined1  [32])valid_i->field_0);
  uVar14 = vmovmskps_avx(auVar28);
  if (uVar14 != 0) {
    local_12e8 = This->ptr;
    local_12e0 = (ulong)(uVar14 & 0xff);
    auVar4 = *(undefined1 (*) [32])(ray + 0x80);
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar42._16_4_ = 0x7fffffff;
    auVar42._20_4_ = 0x7fffffff;
    auVar42._24_4_ = 0x7fffffff;
    auVar42._28_4_ = 0x7fffffff;
    auVar47._8_4_ = 0x219392ef;
    auVar47._0_8_ = 0x219392ef219392ef;
    auVar47._12_4_ = 0x219392ef;
    auVar47._16_4_ = 0x219392ef;
    auVar47._20_4_ = 0x219392ef;
    auVar47._24_4_ = 0x219392ef;
    auVar47._28_4_ = 0x219392ef;
    auVar33 = vandps_avx(auVar4,auVar42);
    auVar33 = vcmpps_avx(auVar33,auVar47,1);
    auVar44 = vblendvps_avx(auVar4,auVar47,auVar33);
    auVar33 = *(undefined1 (*) [32])(ray + 0xa0);
    auVar39 = vandps_avx(auVar33,auVar42);
    auVar39 = vcmpps_avx(auVar39,auVar47,1);
    auVar45 = vblendvps_avx(auVar33,auVar47,auVar39);
    auVar39 = *(undefined1 (*) [32])(ray + 0xc0);
    auVar42 = vandps_avx(auVar39,auVar42);
    auVar42 = vcmpps_avx(auVar42,auVar47,1);
    auVar6 = vrcpps_avx(auVar44);
    auVar42 = vblendvps_avx(auVar39,auVar47,auVar42);
    auVar43._8_4_ = 0x3f800000;
    auVar43._0_8_ = 0x3f8000003f800000;
    auVar43._12_4_ = 0x3f800000;
    auVar43._16_4_ = 0x3f800000;
    auVar43._20_4_ = 0x3f800000;
    auVar43._24_4_ = 0x3f800000;
    auVar43._28_4_ = 0x3f800000;
    auVar7 = vfnmadd213ps_fma(auVar44,auVar6,auVar43);
    auVar44 = vrcpps_avx(auVar45);
    auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar6,auVar6);
    auVar54 = ZEXT1664(auVar7);
    auVar6 = vrcpps_avx(auVar42);
    auVar8 = vfnmadd213ps_fma(auVar45,auVar44,auVar43);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar44,auVar44);
    auVar55 = ZEXT1664(auVar8);
    auVar9 = vfnmadd213ps_fma(auVar42,auVar6,auVar43);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar6,auVar6);
    auVar56 = ZEXT1664(auVar9);
    auVar57 = ZEXT816(0) << 0x40;
    auVar58 = ZEXT1664(auVar57);
    local_1180 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar57));
    local_10e0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar57));
    auVar42 = ZEXT1632(auVar57);
    auVar4 = vcmpps_avx(auVar4,auVar42,1);
    auVar44._8_4_ = 1;
    auVar44._0_8_ = 0x100000001;
    auVar44._12_4_ = 1;
    auVar44._16_4_ = 1;
    auVar44._20_4_ = 1;
    auVar44._24_4_ = 1;
    auVar44._28_4_ = 1;
    auVar4 = vandps_avx(auVar4,auVar44);
    auVar33 = vcmpps_avx(auVar33,auVar42,1);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar33 = vandps_avx(auVar33,auVar45);
    auVar33 = vorps_avx(auVar33,auVar4);
    auVar4 = vcmpps_avx(auVar39,auVar42,1);
    auVar39._8_4_ = 4;
    auVar39._0_8_ = 0x400000004;
    auVar39._12_4_ = 4;
    auVar39._16_4_ = 4;
    auVar39._20_4_ = 4;
    auVar39._24_4_ = 4;
    auVar39._28_4_ = 4;
    auVar4 = vandps_avx(auVar4,auVar39);
    auVar38 = vpor_avx2(auVar28 ^ auVar38,auVar4);
    local_1120 = vpor_avx2(auVar38,auVar33);
    local_1080 = *(float *)ray;
    fStack_107c = *(float *)(ray + 4);
    fStack_1078 = *(float *)(ray + 8);
    fStack_1074 = *(float *)(ray + 0xc);
    fStack_1070 = *(float *)(ray + 0x10);
    fStack_106c = *(float *)(ray + 0x14);
    fStack_1068 = *(float *)(ray + 0x18);
    uStack_1064 = *(uint *)(ray + 0x1c);
    local_1140 = auVar7._0_4_ * -*(float *)ray;
    fStack_113c = auVar7._4_4_ * -*(float *)(ray + 4);
    fStack_1138 = auVar7._8_4_ * -*(float *)(ray + 8);
    fStack_1134 = auVar7._12_4_ * -*(float *)(ray + 0xc);
    fStack_1130 = -*(float *)(ray + 0x10) * 0.0;
    fStack_112c = -*(float *)(ray + 0x14) * 0.0;
    fStack_1128 = -*(float *)(ray + 0x18) * 0.0;
    uStack_1124 = *(uint *)(ray + 0x1c) ^ 0x80000000;
    local_10a0 = *(float *)(ray + 0x20);
    fStack_109c = *(float *)(ray + 0x24);
    fStack_1098 = *(float *)(ray + 0x28);
    fStack_1094 = *(float *)(ray + 0x2c);
    fStack_1090 = *(float *)(ray + 0x30);
    fStack_108c = *(float *)(ray + 0x34);
    fStack_1088 = *(float *)(ray + 0x38);
    uStack_1084 = *(uint *)(ray + 0x3c);
    local_1160 = auVar8._0_4_ * -*(float *)(ray + 0x20);
    fStack_115c = auVar8._4_4_ * -*(float *)(ray + 0x24);
    fStack_1158 = auVar8._8_4_ * -*(float *)(ray + 0x28);
    fStack_1154 = auVar8._12_4_ * -*(float *)(ray + 0x2c);
    fStack_1150 = -*(float *)(ray + 0x30) * 0.0;
    fStack_114c = -*(float *)(ray + 0x34) * 0.0;
    fStack_1148 = -*(float *)(ray + 0x38) * 0.0;
    uStack_1144 = *(uint *)(ray + 0x3c) ^ 0x80000000;
    local_10c0 = *(float *)(ray + 0x40);
    fStack_10bc = *(float *)(ray + 0x44);
    fStack_10b8 = *(float *)(ray + 0x48);
    fStack_10b4 = *(float *)(ray + 0x4c);
    fStack_10b0 = *(float *)(ray + 0x50);
    fStack_10ac = *(float *)(ray + 0x54);
    fStack_10a8 = *(float *)(ray + 0x58);
    uStack_10a4 = *(uint *)(ray + 0x5c);
    local_fe0 = auVar9._0_4_ * -*(float *)(ray + 0x40);
    fStack_fdc = auVar9._4_4_ * -*(float *)(ray + 0x44);
    fStack_fd8 = auVar9._8_4_ * -*(float *)(ray + 0x48);
    fStack_fd4 = auVar9._12_4_ * -*(float *)(ray + 0x4c);
    fStack_fd0 = -*(float *)(ray + 0x50) * 0.0;
    fStack_fcc = -*(float *)(ray + 0x54) * 0.0;
    fStack_fc8 = -*(float *)(ray + 0x58) * 0.0;
    uStack_fc4 = *(uint *)(ray + 0x5c) ^ 0x80000000;
    local_1260 = 0x80000000;
    uStack_125c = 0x80000000;
    uStack_1258 = 0x80000000;
    uStack_1254 = 0x80000000;
    local_1100 = 0x7f800000;
    uStack_10fc = 0x7f800000;
    uStack_10f8 = 0x7f800000;
    uStack_10f4 = 0x7f800000;
    uStack_10f0 = 0x7f800000;
    uStack_10ec = 0x7f800000;
    uStack_10e8 = 0x7f800000;
    uStack_10e4 = 0x7f800000;
    local_1020 = ZEXT1632(auVar7);
    local_1040 = ZEXT1632(auVar8);
    local_1060 = ZEXT1632(auVar9);
    local_12d8 = ray;
    local_12d0 = context;
    do {
      lVar18 = 0;
      for (uVar21 = local_12e0; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar15 = *(undefined4 *)(local_1120 + lVar18 * 4);
      auVar28._4_4_ = uVar15;
      auVar28._0_4_ = uVar15;
      auVar28._8_4_ = uVar15;
      auVar28._12_4_ = uVar15;
      auVar28._16_4_ = uVar15;
      auVar28._20_4_ = uVar15;
      auVar28._24_4_ = uVar15;
      auVar28._28_4_ = uVar15;
      auVar33 = vpcmpeqd_avx2(auVar28,local_1120);
      uVar15 = vmovmskps_avx(auVar33);
      local_12e0 = ~CONCAT44((int)((ulong)lVar18 >> 0x20),uVar15) & local_12e0;
      auVar12._4_4_ = fStack_107c;
      auVar12._0_4_ = local_1080;
      auVar12._8_4_ = fStack_1078;
      auVar12._12_4_ = fStack_1074;
      auVar12._16_4_ = fStack_1070;
      auVar12._20_4_ = fStack_106c;
      auVar12._24_4_ = fStack_1068;
      auVar12._28_4_ = uStack_1064;
      auVar49._8_4_ = 0x7f800000;
      auVar49._0_8_ = 0x7f8000007f800000;
      auVar49._12_4_ = 0x7f800000;
      auVar49._16_4_ = 0x7f800000;
      auVar49._20_4_ = 0x7f800000;
      auVar49._24_4_ = 0x7f800000;
      auVar49._28_4_ = 0x7f800000;
      auVar38 = vblendvps_avx(auVar49,auVar12,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar7 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar6._4_4_ = fStack_109c;
      auVar6._0_4_ = local_10a0;
      auVar6._8_4_ = fStack_1098;
      auVar6._12_4_ = fStack_1094;
      auVar6._16_4_ = fStack_1090;
      auVar6._20_4_ = fStack_108c;
      auVar6._24_4_ = fStack_1088;
      auVar6._28_4_ = uStack_1084;
      auVar38 = vblendvps_avx(auVar49,auVar6,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar8 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar8 = vunpcklps_avx(auVar7,auVar8);
      auVar4._4_4_ = fStack_10bc;
      auVar4._0_4_ = local_10c0;
      auVar4._8_4_ = fStack_10b8;
      auVar4._12_4_ = fStack_10b4;
      auVar4._16_4_ = fStack_10b0;
      auVar4._20_4_ = fStack_10ac;
      auVar4._24_4_ = fStack_10a8;
      auVar4._28_4_ = uStack_10a4;
      auVar38 = vblendvps_avx(auVar49,auVar4,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar7 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      auVar51._16_4_ = 0xff800000;
      auVar51._20_4_ = 0xff800000;
      auVar51._24_4_ = 0xff800000;
      auVar51._28_4_ = 0xff800000;
      auVar38 = vblendvps_avx(auVar51,auVar12,auVar33);
      auVar9 = vinsertps_avx(auVar8,auVar7,0x28);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar28 = vmaxps_avx(auVar38,auVar28);
      auVar38 = vblendvps_avx(auVar51,auVar6,auVar33);
      auVar7 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar8 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar8 = vunpcklps_avx(auVar7,auVar8);
      auVar38 = vblendvps_avx(auVar51,auVar4,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar7 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar5 = vinsertps_avx(auVar8,auVar7,0x28);
      auVar38 = vblendvps_avx(auVar49,auVar54._0_32_,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar7 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar38 = vblendvps_avx(auVar49,auVar55._0_32_,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar8 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar8 = vunpcklps_avx(auVar7,auVar8);
      auVar38 = vblendvps_avx(auVar49,auVar56._0_32_,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar7 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar38 = vblendvps_avx(auVar51,auVar54._0_32_,auVar33);
      auVar31 = vinsertps_avx(auVar8,auVar7,0x28);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar28 = vmaxps_avx(auVar38,auVar28);
      auVar38 = vblendvps_avx(auVar51,auVar55._0_32_,auVar33);
      auVar7 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar8 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar8 = vunpcklps_avx(auVar7,auVar8);
      auVar38 = vblendvps_avx(auVar51,auVar56._0_32_,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vmaxps_avx(auVar38,auVar28);
      auVar7 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar41 = vinsertps_avx(auVar8,auVar7,0x28);
      auVar38 = vblendvps_avx(auVar49,local_1180,auVar33);
      auVar28 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar38 = vminps_avx(auVar38,auVar28);
      auVar28 = vshufpd_avx(auVar38,auVar38,5);
      auVar28 = vminps_avx(auVar38,auVar28);
      local_12a0 = vblendvps_avx(auVar51,local_10e0,auVar33);
      auVar38 = vshufps_avx(local_12a0,local_12a0,0xb1);
      auVar38 = vmaxps_avx(local_12a0,auVar38);
      auVar4 = vshufpd_avx(auVar38,auVar38,5);
      auVar38 = vmaxps_avx(auVar38,auVar4);
      auVar57 = vcmpps_avx(auVar31,_DAT_01f7aa10,5);
      auVar7 = vblendvps_avx(auVar41,auVar31,auVar57);
      auVar8 = vblendvps_avx(auVar9,auVar5,auVar57);
      local_1340 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
      auVar9 = vblendvps_avx(auVar5,auVar9,auVar57);
      local_1190 = auVar7._0_4_;
      auVar5 = vmovshdup_avx(auVar7);
      uVar22 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x20;
      auVar5 = vshufpd_avx(auVar7,auVar7,1);
      uVar27 = (ulong)(auVar5._0_4_ < 0.0) << 4 | 0x40;
      local_12a8 = uVar22 ^ 0x10;
      auVar57 = vblendvps_avx(auVar31,auVar41,auVar57);
      auVar5 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
      auVar41._0_4_ = auVar8._0_4_ * local_1190;
      auVar41._4_4_ = auVar8._4_4_ * auVar7._4_4_;
      auVar41._8_4_ = auVar8._8_4_ * auVar7._8_4_;
      auVar41._12_4_ = auVar8._12_4_ * auVar7._12_4_;
      local_11f0 = auVar57._0_4_;
      auVar31._0_4_ = auVar9._0_4_ * local_11f0;
      auVar31._4_4_ = auVar9._4_4_ * auVar57._4_4_;
      auVar31._8_4_ = auVar9._8_4_ * auVar57._8_4_;
      auVar31._12_4_ = auVar9._12_4_ * auVar57._12_4_;
      uVar21 = (ulong)(local_1190 < 0.0) << 4;
      uVar23 = uVar21 ^ 0x10;
      local_fa0 = *(ulong *)&local_12e8[1].bounds.bounds0.lower.field_0;
      local_f98[0] = 0;
      fStack_118c = local_1190;
      fStack_1188 = local_1190;
      fStack_1184 = local_1190;
      local_11a0 = (uint)auVar41._0_4_ ^ local_1260;
      uStack_119c = (uint)auVar41._0_4_ ^ uStack_125c;
      uStack_1198 = (uint)auVar41._0_4_ ^ uStack_1258;
      uStack_1194 = (uint)auVar41._0_4_ ^ uStack_1254;
      local_11b0 = vshufps_avx(auVar7,auVar7,0x55);
      auVar8 = vshufps_avx(auVar41,auVar41,0x55);
      local_11c0._0_4_ = auVar8._0_4_ ^ local_1260;
      local_11c0._4_4_ = auVar8._4_4_ ^ uStack_125c;
      local_11c0._8_4_ = auVar8._8_4_ ^ uStack_1258;
      local_11c0._12_4_ = auVar8._12_4_ ^ uStack_1254;
      local_11d0 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar7 = vshufps_avx(auVar41,auVar41,0xaa);
      local_11e0 = auVar7._0_4_ ^ local_1260;
      uStack_11dc = auVar7._4_4_ ^ uStack_125c;
      uStack_11d8 = auVar7._8_4_ ^ uStack_1258;
      uStack_11d4 = auVar7._12_4_ ^ uStack_1254;
      fStack_11ec = local_11f0;
      fStack_11e8 = local_11f0;
      fStack_11e4 = local_11f0;
      local_1200 = (uint)auVar31._0_4_ ^ local_1260;
      uStack_11fc = (uint)auVar31._0_4_ ^ uStack_125c;
      uStack_11f8 = (uint)auVar31._0_4_ ^ uStack_1258;
      uStack_11f4 = (uint)auVar31._0_4_ ^ uStack_1254;
      local_1210 = vshufps_avx(auVar57,auVar57,0x55);
      auVar7 = vshufps_avx(auVar31,auVar31,0x55);
      local_1220._0_4_ = auVar7._0_4_ ^ local_1260;
      local_1220._4_4_ = auVar7._4_4_ ^ uStack_125c;
      local_1220._8_4_ = auVar7._8_4_ ^ uStack_1258;
      local_1220._12_4_ = auVar7._12_4_ ^ uStack_1254;
      local_1230 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar7 = vshufps_avx(auVar31,auVar31,0xaa);
      local_1240 = auVar7._0_4_ ^ local_1260;
      uStack_123c = auVar7._4_4_ ^ uStack_125c;
      uStack_1238 = auVar7._8_4_ ^ uStack_1258;
      uStack_1234 = auVar7._12_4_ ^ uStack_1254;
      local_1250 = auVar5._0_4_;
      uStack_124c = local_1250;
      uStack_1248 = local_1250;
      uStack_1244 = local_1250;
      auVar38._4_4_ = uStack_10fc;
      auVar38._0_4_ = local_1100;
      auVar38._8_4_ = uStack_10f8;
      auVar38._12_4_ = uStack_10f4;
      auVar38._16_4_ = uStack_10f0;
      auVar38._20_4_ = uStack_10ec;
      auVar38._24_4_ = uStack_10e8;
      auVar38._28_4_ = uStack_10e4;
      local_fc0 = vblendvps_avx(auVar38,local_1180,auVar33);
      puVar17 = local_f90;
      uVar15 = local_1340._0_4_;
      auVar30 = ZEXT1664(CONCAT412(uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))));
      auVar52 = ZEXT3264(CONCAT428(uStack_1124,
                                   CONCAT424(fStack_1128,
                                             CONCAT420(fStack_112c,
                                                       CONCAT416(fStack_1130,
                                                                 CONCAT412(fStack_1134,
                                                                           CONCAT48(fStack_1138,
                                                                                    CONCAT44(
                                                  fStack_113c,local_1140))))))));
      auVar53 = ZEXT3264(CONCAT428(uStack_1144,
                                   CONCAT424(fStack_1148,
                                             CONCAT420(fStack_114c,
                                                       CONCAT416(fStack_1150,
                                                                 CONCAT412(fStack_1154,
                                                                           CONCAT48(fStack_1158,
                                                                                    CONCAT44(
                                                  fStack_115c,local_1160))))))));
      local_12c8 = uVar22;
      local_12c0 = uVar21;
      do {
        uVar15 = (undefined4)puVar17[-1];
        auVar33._4_4_ = uVar15;
        auVar33._0_4_ = uVar15;
        auVar33._8_4_ = uVar15;
        auVar33._12_4_ = uVar15;
        auVar33._16_4_ = uVar15;
        auVar33._20_4_ = uVar15;
        auVar33._24_4_ = uVar15;
        auVar33._28_4_ = uVar15;
        auVar34 = ZEXT3264(auVar33);
        puVar17 = puVar17 + -2;
        auVar38 = vcmpps_avx(auVar33,local_12a0,1);
        if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0x7f,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0xbf,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar38[0x1f] < '\0') {
          uVar24 = *puVar17;
          while ((uVar24 & 8) == 0) {
            auVar7._4_4_ = uStack_119c;
            auVar7._0_4_ = local_11a0;
            auVar7._8_4_ = uStack_1198;
            auVar7._12_4_ = uStack_1194;
            auVar11._4_4_ = fStack_118c;
            auVar11._0_4_ = local_1190;
            auVar11._8_4_ = fStack_1188;
            auVar11._12_4_ = fStack_1184;
            auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar21),auVar7,auVar11);
            auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar22),local_11c0,
                                     local_11b0);
            auVar7 = vpmaxsd_avx(auVar7,auVar8);
            auVar10._4_4_ = uStack_11dc;
            auVar10._0_4_ = local_11e0;
            auVar10._8_4_ = uStack_11d8;
            auVar10._12_4_ = uStack_11d4;
            auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar27),auVar10,
                                     local_11d0);
            auVar9._4_4_ = uStack_124c;
            auVar9._0_4_ = local_1250;
            auVar9._8_4_ = uStack_1248;
            auVar9._12_4_ = uStack_1244;
            auVar8 = vpmaxsd_avx(auVar8,auVar9);
            auVar7 = vpmaxsd_avx(auVar7,auVar8);
            auVar8._4_4_ = uStack_11fc;
            auVar8._0_4_ = local_1200;
            auVar8._8_4_ = uStack_11f8;
            auVar8._12_4_ = uStack_11f4;
            auVar5._4_4_ = fStack_11ec;
            auVar5._0_4_ = local_11f0;
            auVar5._8_4_ = fStack_11e8;
            auVar5._12_4_ = fStack_11e4;
            auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar23),auVar8,auVar5);
            auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + local_12a8),local_1220,
                                     local_1210);
            auVar8 = vpminsd_avx(auVar8,auVar9);
            auVar57._4_4_ = uStack_123c;
            auVar57._0_4_ = local_1240;
            auVar57._8_4_ = uStack_1238;
            auVar57._12_4_ = uStack_1234;
            auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar27 ^ 0x10)),auVar57
                                     ,local_1230);
            auVar9 = vpminsd_avx(auVar9,auVar30._0_16_);
            auVar8 = vpminsd_avx(auVar8,auVar9);
            local_1280._0_16_ = auVar7;
            auVar7 = vcmpps_avx(auVar7,auVar8,2);
            uVar14 = vmovmskps_avx(auVar7);
            if (uVar14 == 0) goto LAB_00594393;
            uVar20 = (ulong)(uVar14 & 0xff);
            auVar34 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            uVar19 = 0;
            uVar25 = 8;
            do {
              lVar18 = 0;
              for (uVar26 = uVar20; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar15 = *(undefined4 *)(uVar24 + 0x20 + lVar18 * 4);
              auVar35._4_4_ = uVar15;
              auVar35._0_4_ = uVar15;
              auVar35._8_4_ = uVar15;
              auVar35._12_4_ = uVar15;
              auVar35._16_4_ = uVar15;
              auVar35._20_4_ = uVar15;
              auVar35._24_4_ = uVar15;
              auVar35._28_4_ = uVar15;
              uVar15 = *(undefined4 *)(uVar24 + 0x40 + lVar18 * 4);
              auVar37._4_4_ = uVar15;
              auVar37._0_4_ = uVar15;
              auVar37._8_4_ = uVar15;
              auVar37._12_4_ = uVar15;
              auVar37._16_4_ = uVar15;
              auVar37._20_4_ = uVar15;
              auVar37._24_4_ = uVar15;
              auVar37._28_4_ = uVar15;
              auVar7 = vfmadd213ps_fma(auVar35,auVar54._0_32_,auVar52._0_32_);
              auVar8 = vfmadd213ps_fma(auVar37,auVar55._0_32_,auVar53._0_32_);
              uVar15 = *(undefined4 *)(uVar24 + 0x60 + lVar18 * 4);
              auVar40._4_4_ = uVar15;
              auVar40._0_4_ = uVar15;
              auVar40._8_4_ = uVar15;
              auVar40._12_4_ = uVar15;
              auVar40._16_4_ = uVar15;
              auVar40._20_4_ = uVar15;
              auVar40._24_4_ = uVar15;
              auVar40._28_4_ = uVar15;
              auVar13._4_4_ = fStack_fdc;
              auVar13._0_4_ = local_fe0;
              auVar13._8_4_ = fStack_fd8;
              auVar13._12_4_ = fStack_fd4;
              auVar13._16_4_ = fStack_fd0;
              auVar13._20_4_ = fStack_fcc;
              auVar13._24_4_ = fStack_fc8;
              auVar13._28_4_ = uStack_fc4;
              auVar9 = vfmadd213ps_fma(auVar40,auVar56._0_32_,auVar13);
              uVar15 = *(undefined4 *)(uVar24 + 0x30 + lVar18 * 4);
              auVar46._4_4_ = uVar15;
              auVar46._0_4_ = uVar15;
              auVar46._8_4_ = uVar15;
              auVar46._12_4_ = uVar15;
              auVar46._16_4_ = uVar15;
              auVar46._20_4_ = uVar15;
              auVar46._24_4_ = uVar15;
              auVar46._28_4_ = uVar15;
              auVar57 = vfmadd213ps_fma(auVar46,auVar54._0_32_,auVar52._0_32_);
              uVar15 = *(undefined4 *)(uVar24 + 0x50 + lVar18 * 4);
              auVar48._4_4_ = uVar15;
              auVar48._0_4_ = uVar15;
              auVar48._8_4_ = uVar15;
              auVar48._12_4_ = uVar15;
              auVar48._16_4_ = uVar15;
              auVar48._20_4_ = uVar15;
              auVar48._24_4_ = uVar15;
              auVar48._28_4_ = uVar15;
              uVar15 = *(undefined4 *)(uVar24 + 0x70 + lVar18 * 4);
              auVar50._4_4_ = uVar15;
              auVar50._0_4_ = uVar15;
              auVar50._8_4_ = uVar15;
              auVar50._12_4_ = uVar15;
              auVar50._16_4_ = uVar15;
              auVar50._20_4_ = uVar15;
              auVar50._24_4_ = uVar15;
              auVar50._28_4_ = uVar15;
              auVar5 = vfmadd213ps_fma(auVar48,auVar55._0_32_,auVar53._0_32_);
              auVar31 = vfmadd213ps_fma(auVar50,auVar56._0_32_,auVar13);
              auVar38 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar57));
              auVar28 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
              auVar38 = vpmaxsd_avx2(auVar38,auVar28);
              auVar28 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar31));
              auVar28 = vpmaxsd_avx2(auVar28,local_fc0);
              auVar38 = vpmaxsd_avx2(auVar38,auVar28);
              auVar28 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar57));
              auVar4 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
              auVar4 = vpminsd_avx2(auVar28,auVar4);
              auVar28 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar31));
              auVar28 = vpminsd_avx2(auVar28,local_12a0);
              auVar28 = vpminsd_avx2(auVar4,auVar28);
              auVar38 = vcmpps_avx(auVar38,auVar28,2);
              uVar26 = uVar25;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                uVar15 = *(undefined4 *)(local_1280 + lVar18 * 4);
                auVar32._4_4_ = uVar15;
                auVar32._0_4_ = uVar15;
                auVar32._8_4_ = uVar15;
                auVar32._12_4_ = uVar15;
                auVar36._16_4_ = uVar15;
                auVar36._0_16_ = auVar32;
                auVar36._20_4_ = uVar15;
                auVar36._24_4_ = uVar15;
                auVar36._28_4_ = uVar15;
                uVar26 = *(ulong *)(uVar24 + lVar18 * 8);
                auVar38 = vcmpps_avx(auVar36,auVar34._0_32_,1);
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar38[0x1f]) {
                  *puVar17 = uVar26;
                  uVar26 = uVar25;
                }
                else {
                  if (uVar25 == 8) {
                    auVar34 = ZEXT3264(auVar36);
                    goto LAB_00594110;
                  }
                  *puVar17 = uVar25;
                  auVar32 = auVar34._0_16_;
                  auVar34 = ZEXT3264(auVar36);
                }
                uVar19 = uVar19 + 1;
                *(int *)(puVar17 + 1) = auVar32._0_4_;
                puVar17 = puVar17 + 2;
              }
LAB_00594110:
              uVar20 = uVar20 - 1 & uVar20;
              uVar25 = uVar26;
            } while (uVar20 != 0);
            if (uVar26 == 8) goto LAB_00594393;
            uVar24 = uVar26;
            if (1 < uVar19) {
              puVar1 = puVar17 + -4;
              puVar2 = puVar17 + -2;
              if ((uint)puVar17[-3] < (uint)puVar17[-1]) {
                uVar25 = *puVar1;
                uVar20 = puVar17[-3];
                *(int *)(puVar17 + -3) = (int)puVar17[-1];
                *puVar1 = *puVar2;
                *puVar2 = uVar25;
                local_1330.geometryUserPtr._0_4_ = (undefined4)uVar20;
                *(undefined4 *)(puVar17 + -1) = local_1330.geometryUserPtr._0_4_;
              }
              if (uVar19 != 2) {
                puVar3 = puVar17 + -6;
                uVar14 = (uint)puVar17[-5];
                if (uVar14 < (uint)puVar17[-1]) {
                  uVar25 = *puVar3;
                  uVar19 = puVar17[-5];
                  *(int *)(puVar17 + -5) = (int)puVar17[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = uVar25;
                  local_1330.geometryUserPtr._0_4_ = (undefined4)uVar19;
                  *(undefined4 *)(puVar17 + -1) = local_1330.geometryUserPtr._0_4_;
                  uVar14 = (uint)puVar17[-5];
                }
                if (uVar14 < (uint)puVar17[-3]) {
                  uVar25 = *puVar3;
                  uVar19 = puVar17[-5];
                  *(int *)(puVar17 + -5) = (int)puVar17[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = uVar25;
                  local_1330.geometryUserPtr._0_4_ = (undefined4)uVar19;
                  *(undefined4 *)(puVar17 + -3) = local_1330.geometryUserPtr._0_4_;
                }
              }
            }
          }
          auVar38 = vcmpps_avx(local_12a0,auVar34._0_32_,6);
          auVar30 = ZEXT3264(auVar38);
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            lVar18 = (ulong)((uint)uVar24 & 0xf) - 8;
            if (lVar18 != 0) {
              local_12b0 = 0;
              local_1000 = auVar38;
              local_12b8 = lVar18;
              do {
                local_1330.geomID = *(uint *)((uVar24 & 0xfffffffffffffff0) + local_12b0 * 8);
                local_1300 = (context->scene->geometries).items[local_1330.geomID].ptr;
                uVar14 = local_1300->mask;
                auVar29._4_4_ = uVar14;
                auVar29._0_4_ = uVar14;
                auVar29._8_4_ = uVar14;
                auVar29._12_4_ = uVar14;
                auVar29._16_4_ = uVar14;
                auVar29._20_4_ = uVar14;
                auVar29._24_4_ = uVar14;
                auVar29._28_4_ = uVar14;
                auVar38 = vpand_avx2(auVar29,*(undefined1 (*) [32])(ray + 0x120));
                auVar28 = vpcmpeqd_avx2(auVar58._0_32_,auVar38);
                auVar38 = auVar30._0_32_ & ~auVar28;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar38 >> 0x7f,0) != '\0') ||
                      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0xbf,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar38[0x1f] < '\0') {
                  local_1280 = vandnps_avx(auVar28,auVar30._0_32_);
                  local_1330.primID = *(uint *)((uVar24 & 0xfffffffffffffff0) + 4 + local_12b0 * 8);
                  local_1330.valid = (int *)local_1280;
                  local_1330.geometryUserPtr = local_1300->userPtr;
                  local_1330.context = context->user;
                  local_1330.N = 8;
                  local_12f8 = 0;
                  local_12f0 = context->args;
                  pp_Var16 = (_func_int **)local_12f0->intersect;
                  if (pp_Var16 == (_func_int **)0x0) {
                    pp_Var16 = local_1300[1].super_RefCount._vptr_RefCount;
                  }
                  local_1330.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var16)(&local_1330);
                  auVar54 = ZEXT3264(local_1020);
                  auVar55 = ZEXT3264(local_1040);
                  auVar56 = ZEXT3264(local_1060);
                  auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar52 = ZEXT3264(CONCAT428(uStack_1124,
                                               CONCAT424(fStack_1128,
                                                         CONCAT420(fStack_112c,
                                                                   CONCAT416(fStack_1130,
                                                                             CONCAT412(fStack_1134,
                                                                                       CONCAT48(
                                                  fStack_1138,CONCAT44(fStack_113c,local_1140)))))))
                                    );
                  auVar53 = ZEXT3264(CONCAT428(uStack_1144,
                                               CONCAT424(fStack_1148,
                                                         CONCAT420(fStack_114c,
                                                                   CONCAT416(fStack_1150,
                                                                             CONCAT412(fStack_1154,
                                                                                       CONCAT48(
                                                  fStack_1158,CONCAT44(fStack_115c,local_1160)))))))
                                    );
                  auVar30 = ZEXT3264(local_1000);
                  context = local_12d0;
                  ray = local_12d8;
                  lVar18 = local_12b8;
                  uVar21 = local_12c0;
                  uVar22 = local_12c8;
                }
                auVar38 = auVar30._0_32_;
                local_12b0 = local_12b0 + 1;
              } while (lVar18 != local_12b0);
            }
            auVar28 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),local_12a0,1);
            auVar28 = auVar38 & auVar28;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              local_12a0 = vblendvps_avx(local_12a0,*(undefined1 (*) [32])(ray + 0x100),auVar38);
              auVar38 = vshufps_avx(local_12a0,local_12a0,0xb1);
              auVar38 = vmaxps_avx(local_12a0,auVar38);
              auVar28 = vshufpd_avx(auVar38,auVar38,5);
              auVar38 = vmaxps_avx(auVar38,auVar28);
              local_1340 = vmaxss_avx(auVar38._0_16_,auVar38._16_16_);
            }
          }
        }
        uVar15 = local_1340._0_4_;
        auVar30 = ZEXT1664(CONCAT412(uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))));
LAB_00594393:
      } while (puVar17 != &local_fa0);
    } while (local_12e0 != 0);
  }
  return;
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }